

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

ValueType * __thiscall
HighsHashTable<int,_int>::operator[](HighsHashTable<int,_int> *this,KeyType_conflict *key)

{
  byte bVar1;
  uchar uVar2;
  _Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false> _Var3;
  uchar *puVar4;
  HighsHashTableEntry<int,_int> HVar5;
  undefined8 uVar6;
  bool bVar7;
  ValueType *pVVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  u8 meta;
  Entry entry;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  uchar local_39;
  HighsHashTableEntry<int,_int> local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>.
       _M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  bVar7 = findPosition(this,key,&local_39,&local_20,&local_28,&local_30);
  if (bVar7) {
    return (int *)((long)(_Var3._M_head_impl + local_30) + 4);
  }
  uVar9 = this->tableSizeMask;
  if ((this->numElements == uVar9 * 7 + 7 >> 3) || (local_30 == local_28)) {
    growTable(this);
  }
  else {
    local_38.value_ = 0;
    local_38.key_ = *key;
    uVar6 = _Var3._M_head_impl + local_30;
    this->numElements = this->numElements + 1;
    uVar10 = local_28;
    do {
      puVar4 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      bVar1 = puVar4[local_30];
      if (-1 < (char)bVar1) {
        puVar4[local_30] = local_39;
        _Var3._M_head_impl[local_30] = local_38;
        return (int *)(uVar6 + 4);
      }
      uVar11 = (ulong)((int)local_30 - (uint)bVar1 & 0x7f);
      if (uVar11 < (local_30 - local_20 & uVar9)) {
        HVar5 = _Var3._M_head_impl[local_30];
        _Var3._M_head_impl[local_30] = local_38;
        puVar4 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        uVar2 = puVar4[local_30];
        puVar4[local_30] = local_39;
        uVar9 = this->tableSizeMask;
        local_20 = local_30 - uVar11 & uVar9;
        uVar10 = local_20 + 0x7f & uVar9;
        local_39 = uVar2;
        local_38 = HVar5;
        local_28 = uVar10;
      }
      local_30 = local_30 + 1 & uVar9;
    } while (local_30 != uVar10);
    growTable(this);
    HighsHashTable<int,int>::insert<HighsHashTableEntry<int,int>>
              ((HighsHashTable<int,int> *)this,&local_38);
  }
  pVVar8 = operator[](this,key);
  return pVVar8;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }